

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab8-0.c
# Opt level: O0

int Check(void)

{
  ulong uVar1;
  undefined8 __s;
  int iVar2;
  uint vertexCount_00;
  uint edgeIdx_00;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  size_t __n;
  char *pcVar5;
  TTestcaseData TVar6;
  ulong local_4f28;
  unsigned_long_long local_4f10;
  uint rootB;
  uint rootA;
  uint edgeIdx;
  uint b;
  uint a;
  uint idx;
  unsigned_long_long length;
  uint vertexParent [5000];
  char local_b8 [4];
  uint vertexCount;
  char bufMsg [128];
  char *message;
  char *status;
  FILE *out;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
    goto LAB_001018a3;
  }
  message = "PASSED";
  join_0x00000010_0x00000000_ = GetFromTestcase(TestcaseIdx,ERROR_MESSAGE,0xffffffff);
  __s = bufMsg._120_8_;
  if (bufMsg._120_8_ == 0) {
    vertexCount_00 = GetVertexCount();
    _a = 0;
    InitParent(vertexCount_00,(uint *)&length);
    for (b = 0; b + 1 < vertexCount_00; b = b + 1) {
      pcVar5 = ScanUintUint((FILE *)__stream,&edgeIdx,&rootA);
      if (pcVar5 != "PASSED") {
        message = "FAILED";
        break;
      }
      edgeIdx_00 = FindEdge(edgeIdx,rootA);
      if (edgeIdx_00 == 0xffffffff) {
        printf("wrong output -- ");
        message = "FAILED";
        break;
      }
      uVar3 = FindRoot(edgeIdx - 1,(uint *)&length);
      uVar4 = FindRoot(rootA - 1,(uint *)&length);
      if (uVar3 == uVar4) {
        printf("wrong output -- ");
        message = "FAILED";
        break;
      }
      vertexParent[(ulong)uVar3 - 2] = uVar4;
      TVar6 = GetFromTestcase(TestcaseIdx,EDGE,edgeIdx_00);
      local_4f10 = TVar6.Edge.Length;
      _a = local_4f10 + _a;
    }
    if (message == "PASSED") {
      iVar2 = CountRoots(vertexCount_00,(uint *)&length);
      uVar1 = _a;
      if (iVar2 == 1) {
        TVar6 = GetFromTestcase(TestcaseIdx,MST_LENGTH,0xffffffff);
        local_4f28 = TVar6.Integer;
        if (uVar1 <= local_4f28) goto LAB_0010183d;
      }
      printf("wrong output -- ");
      message = "FAILED";
    }
  }
  else {
    memset(local_b8,0,0x80);
    message = ScanChars((FILE *)__stream,0x80,local_b8);
    if (message == "PASSED") {
      __n = strlen((char *)__s);
      iVar2 = strncasecmp((char *)__s,local_b8,__n);
      if (iVar2 != 0) {
        printf("wrong output -- ");
        message = "FAILED";
      }
    }
  }
LAB_0010183d:
  if ((message == "PASSED") && (iVar2 = HaveGarbageAtTheEnd((FILE *)__stream), iVar2 != 0)) {
    message = "FAILED";
  }
  fclose(__stream);
  printf("%s\n",message);
  out._4_4_ = (uint)(message == "FAILED");
LAB_001018a3:
  TestcaseIdx = TestcaseIdx + 1;
  return out._4_4_;
}

Assistant:

static int Check(void) {
    FILE* const out = fopen("out.txt", "r");
    if (out == NULL) {
        printf("can't open out.txt\n");
        ++TestcaseIdx;
        return -1;
    }
    const char* status = Pass;
    const char* message = GetFromTestcase(TestcaseIdx, ERROR_MESSAGE, IGNORED_EDGE_IDX).String;
    if (message != NULL) { // test error message
        char bufMsg[128] = {0};
        status = ScanChars(out, sizeof(bufMsg), bufMsg);
        if (status == Pass && _strnicmp(message, bufMsg, strlen(message)) != 0) {
            printf("wrong output -- ");
            status = Fail;
        }
    } else { // test spanning tree
        const unsigned vertexCount = GetVertexCount();
        unsigned vertexParent[MAX_VERTEX_COUNT];
        unsigned long long length = 0;
        InitParent(vertexCount, vertexParent);
        for (unsigned idx = 0; idx + 1 < vertexCount; ++idx) {
            unsigned a, b;
            if (ScanUintUint(out, &a, &b) != Pass) {
                status = Fail;
                break;
            }
            const unsigned edgeIdx = FindEdge(a, b);
            if (edgeIdx == IGNORED_EDGE_IDX) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            const unsigned rootA = FindRoot(a - 1, vertexParent);
            const unsigned rootB = FindRoot(b - 1, vertexParent);
            if (rootA == rootB) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            vertexParent[rootA] = rootB;
            length += GetFromTestcase(TestcaseIdx, EDGE, edgeIdx).Edge.Length;
        }
        if (status == Pass) {
            if (CountRoots(vertexCount, vertexParent) != 1 || length > GetFromTestcase(TestcaseIdx, MST_LENGTH, IGNORED_EDGE_IDX).Integer) {
                printf("wrong output -- ");
                status = Fail;
            }
        }
    }
    if (status == Pass && HaveGarbageAtTheEnd(out)) {
        status = Fail;
    }
    fclose(out);
    printf("%s\n", status);
    ++TestcaseIdx;
    return status == Fail;
}